

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FboCases::BlendTest::BlendTest
          (BlendTest *this,Context *context,FboConfig *config,bool npot)

{
  char *pcVar1;
  int iVar2;
  string local_a0;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_21;
  FboConfig *pFStack_20;
  bool npot_local;
  FboConfig *config_local;
  Context *context_local;
  BlendTest *this_local;
  
  pcVar1 = "blend_";
  if (npot) {
    pcVar1 = "blend_npot_";
  }
  local_21 = npot;
  pFStack_20 = config;
  config_local = (FboConfig *)context;
  context_local = (Context *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar1,&local_69);
  FboConfig::getName_abi_cxx11_(&local_a0,pFStack_20);
  std::operator+(&local_48,&local_68,&local_a0);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FboRenderCase::FboRenderCase(&this->super_FboRenderCase,context,pcVar1,"Blend to fbo",pFStack_20);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlendTest_03291b50;
  iVar2 = 0x80;
  if ((local_21 & 1) != 0) {
    iVar2 = 0x6f;
  }
  this->m_fboWidth = iVar2;
  iVar2 = 0x80;
  if ((local_21 & 1) != 0) {
    iVar2 = 0x7a;
  }
  this->m_fboHeight = iVar2;
  return;
}

Assistant:

BlendTest::BlendTest (Context& context, const FboConfig& config, bool npot)
	: FboRenderCase	(context, (string(npot ? "blend_npot_" : "blend_") + config.getName()).c_str(), "Blend to fbo", config)
	, m_fboWidth	(npot ? 111 : 128)
	, m_fboHeight	(npot ? 122 : 128)
{
}